

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O0

shared_ptr<KmerList> __thiscall
BatchKmersCounter::kmerCountOMP
          (BatchKmersCounter *this,uint8_t K,PairedReadsDatastore *reads,uint64_t gfrom,uint64_t gto
          ,uint64_t batch_size)

{
  pointer *this_00;
  KMerNodeFreq_s *pKVar1;
  atomic<unsigned_char> *__ptr;
  long lVar2;
  bool bVar3;
  byte bVar4;
  __int_type _Var5;
  ushort uVar6;
  int iVar7;
  ulong uVar8;
  ostream *poVar9;
  atomic_uint_fast8_t *paVar10;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *pvVar11;
  reference puVar12;
  element_type *peVar13;
  reference pvVar14;
  size_type sVar15;
  void *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __atomic_base<unsigned_char> *this_02;
  shared_ptr<KmerList> sVar16;
  value_type *in_stack_fffffffffffffb28;
  vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
  *in_stack_fffffffffffffb30;
  ostream *local_4c8;
  vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_> *this_03;
  size_type in_stack_fffffffffffffb48;
  vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
  *in_stack_fffffffffffffb50;
  pointer *this_04;
  undefined1 in_stack_fffffffffffffb5b;
  LogLevels in_stack_fffffffffffffb5c;
  ostream *local_478;
  ulong local_470 [3];
  char *local_458;
  uint64_t local_450;
  atomic_uint_fast8_t *local_448;
  ostream *local_440;
  ostream *local_438;
  ostream *local_430;
  ostream *local_428;
  ulong local_420;
  BatchKmersCounter *local_418;
  element_type *local_410;
  reference local_408;
  atomic<unsigned_char> **bs;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_> *__range1_1;
  uint16_t slot;
  bool just_merged;
  uint16_t merge_level;
  unsigned___int128 *rk;
  iterator __end3;
  iterator __begin3;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *__range3;
  uint64_t rid;
  StreamKmerFactory128 skf;
  uint64_t last_kmer;
  uint64_t total_good_length;
  shared_ptr<KmerList> local_kmer_list;
  uint64_t to;
  uint64_t read_count;
  uint64_t from;
  int batch;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> read_kmers;
  ReadSequenceBuffer bprsg;
  atomic_uint_fast8_t *l;
  atomic_uint_fast8_t *__end1;
  atomic_uint_fast8_t *__begin1;
  atomic_uint_fast8_t (*__range1) [2487787];
  unsigned_long __vla_expr0;
  ulong local_88;
  uint64_t elements;
  undefined1 local_78 [6];
  uint16_t levels;
  vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  batch_lists;
  vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_> batch_status;
  uint64_t batches;
  uint64_t totalKmers;
  uint64_t batch_size_local;
  uint64_t gto_local;
  uint64_t gfrom_local;
  PairedReadsDatastore *reads_local;
  uint8_t K_local;
  shared_ptr<KmerList> *kmer_list;
  
  batches = 0;
  local_418 = this;
  local_410 = (element_type *)this;
  totalKmers = batch_size;
  if (batch_size == 0) {
    local_420 = gto - gfrom;
    iVar7 = omp_get_max_threads();
    totalKmers = local_420 / (ulong)(long)(iVar7 << 2) + 1;
  }
  uVar8 = (((gto - gfrom) + totalKmers) - 1) / totalKmers;
  poVar9 = sdglib::OutputLog(in_stack_fffffffffffffb5c,(bool)in_stack_fffffffffffffb5b);
  poVar9 = std::operator<<(poVar9,"OMP-merge kmer counting in ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar8);
  poVar9 = std::operator<<(poVar9," batches of ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,totalKmers);
  poVar9 = std::operator<<(poVar9," reads");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>::vector
            ((vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_> *)
             0x4875ea);
  std::
  vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ::vector((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
            *)0x4875f3);
  elements._6_2_ = 0;
  for (local_88 = uVar8; 1 < local_88; local_88 = local_88 + 1 >> 1) {
    calloc(1,local_88);
    std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>::
    push_back(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    std::
    vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
    ::emplace_back<>((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                      *)in_stack_fffffffffffffb30);
    std::
    vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
    ::back((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
            *)in_stack_fffffffffffffb30);
    std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::resize
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    elements._6_2_ = elements._6_2_ + 1;
  }
  local_428 = sdglib::OutputLog(in_stack_fffffffffffffb5c,(bool)in_stack_fffffffffffffb5b);
  local_430 = std::operator<<(local_428,"Created ");
  local_438 = (ostream *)std::ostream::operator<<(local_430,elements._6_2_);
  local_440 = std::operator<<(local_438," levels");
  std::ostream::operator<<(local_440,std::endl<char,std::char_traits<char>>);
  lVar2 = -(ulong)(elements._6_2_ + 0xf & 0xfffffff0);
  paVar10 = (atomic_uint_fast8_t *)(&stack0xfffffffffffffb28 + lVar2);
  local_448 = paVar10;
  for (__end1 = paVar10; __end1 != paVar10 + elements._6_2_; __end1 = __end1 + 1) {
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487785;
    std::__atomic_base<unsigned_char>::operator=
              (*(__atomic_base<unsigned_char> **)((long)&local_4c8 + lVar2),
               (&stack0xfffffffffffffb37)[lVar2]);
  }
  *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x4877b3;
  ReadSequenceBuffer::ReadSequenceBuffer
            (*(ReadSequenceBuffer **)(&stack0xfffffffffffffb40 + lVar2),
             *(PairedReadsDatastore **)((long)&local_4c8 + lVar2),
             *(size_t *)(&stack0xfffffffffffffb30 + lVar2),*(size_t *)paVar10);
  *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x4877c1;
  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::vector
            (*(vector<unsigned___int128,_std::allocator<unsigned___int128>_> **)
              (&stack0xfffffffffffffb20 + lVar2));
  from._4_4_ = 0;
  do {
    if (uVar8 <= (ulong)(long)from._4_4_) {
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e3d;
      std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::~vector
                (*(vector<unsigned___int128,_std::allocator<unsigned___int128>_> **)
                  (&stack0xfffffffffffffb40 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e49;
      ReadSequenceBuffer::~ReadSequenceBuffer
                (*(ReadSequenceBuffer **)(&stack0xfffffffffffffb30 + lVar2));
      this_03 = (vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                 *)local_78;
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e59;
      pvVar14 = std::
                vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ::back(*(vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                         **)(&stack0xfffffffffffffb30 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e65;
      std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
      operator[](pvVar14,0);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e6d;
      std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
                  (&stack0xfffffffffffffb20 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e80;
      pvVar14 = std::
                vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ::back(*(vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                         **)(&stack0xfffffffffffffb30 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e8d;
      std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
      operator[](pvVar14,1);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e95;
      std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                (*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
                  (&stack0xfffffffffffffb30 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ea4;
      KmerList::merge(*(KmerList **)((long)local_470 + lVar2),
                      *(KmerList **)((long)&local_478 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487eb6;
      pvVar14 = std::
                vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ::back(*(vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                         **)(&stack0xfffffffffffffb30 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ec2;
      std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
      operator[](pvVar14,0);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ed1;
      std::shared_ptr<KmerList>::shared_ptr
                (*(shared_ptr<KmerList> **)(&stack0xfffffffffffffb30 + lVar2),
                 *(shared_ptr<KmerList> **)paVar10);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487eda;
      pvVar14 = std::
                vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ::back(*(vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                         **)(&stack0xfffffffffffffb30 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ee6;
      std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
      operator[](pvVar14,0);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487eee;
      std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::reset
                (*(__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> **)
                  (&stack0xfffffffffffffb40 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ef7;
      pvVar14 = std::
                vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ::back(*(vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                         **)(&stack0xfffffffffffffb30 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487f04;
      std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
      operator[](pvVar14,1);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487f0c;
      std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::reset
                (*(__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> **)
                  (&stack0xfffffffffffffb40 + lVar2));
      __begin1_1._M_current =
           (atomic<unsigned_char> **)
           &batch_lists.
            super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487f23;
      __end1_1 = std::
                 vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                 ::begin(*(vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                           **)paVar10);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487f36;
      bs = (atomic<unsigned_char> **)
           std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
           ::end(*(vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                   **)paVar10);
      while( true ) {
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487f50;
        bVar3 = __gnu_cxx::operator!=
                          (*(__normal_iterator<std::atomic<unsigned_char>_**,_std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>_>
                             **)(&stack0xfffffffffffffb30 + lVar2),
                           *(__normal_iterator<std::atomic<unsigned_char>_**,_std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>_>
                             **)paVar10);
        if (!bVar3) break;
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487f62;
        local_408 = __gnu_cxx::
                    __normal_iterator<std::atomic<unsigned_char>_**,_std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>_>
                    ::operator*(&__end1_1);
        __ptr = *local_408;
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487f78;
        free(__ptr);
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487f84;
        __gnu_cxx::
        __normal_iterator<std::atomic<unsigned_char>_**,_std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>_>
        ::operator++(&__end1_1);
      }
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487faf;
      poVar9 = sdglib::OutputLog(*(LogLevels *)(&stack0xfffffffffffffb5c + lVar2),
                                 (bool)(&stack0xfffffffffffffb5b)[lVar2]);
      local_4c8 = poVar9;
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487fcb;
      poVar9 = std::operator<<(poVar9,"Total kmers processed ");
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487fe4;
      this_01 = (void *)std::ostream::operator<<(poVar9,batches);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x488000;
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
      ::~vector((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                 *)this_03);
      std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>::
      ~vector(this_03);
      sVar16.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar16.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_410;
      return (shared_ptr<KmerList>)sVar16.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
    }
    __range3 = (vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
               (gfrom + (long)from._4_4_ * totalKmers);
    if ((ulong)(long)from._4_4_ < uVar8 - 1) {
      local_450 = totalKmers;
    }
    else {
      local_450 = (gto - gfrom) - totalKmers * (uVar8 - 1);
    }
    pvVar11 = (vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
              ((long)&(__range3->
                      super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                      _M_impl.super__Vector_impl_data._M_start + local_450);
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x48786b;
    std::make_shared<KmerList>();
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x4878a0;
    std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
                (&stack0xfffffffffffffb20 + lVar2));
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x4878af;
    KmerList::resize(*(KmerList **)(&stack0xfffffffffffffb30 + lVar2),*(size_t *)paVar10);
    skf.super_KMerFactory128.b2r._M_elems[0xf8] = '\0';
    skf.super_KMerFactory128.b2r._M_elems[0xf9] = '\0';
    skf.super_KMerFactory128.b2r._M_elems[0xfa] = '\0';
    skf.super_KMerFactory128.b2r._M_elems[0xfb] = '\0';
    skf.super_KMerFactory128.b2r._M_elems[0xfc] = '\0';
    skf.super_KMerFactory128.b2r._M_elems[0xfd] = '\0';
    skf.super_KMerFactory128.b2r._M_elems[0xfe] = '\0';
    skf.super_KMerFactory128.b2r._M_elems[0xff] = '\0';
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x4878cc;
    StreamKmerFactory128::StreamKmerFactory128
              (*(StreamKmerFactory128 **)(&stack0xfffffffffffffb30 + lVar2),
               (&stack0xfffffffffffffb2f)[lVar2]);
    while (__range3 = (vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                      ((long)&(__range3->
                              super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1), __range3 <= pvVar11)
    {
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487907;
      local_458 = ReadSequenceBuffer::get_read_sequence
                            (*(ReadSequenceBuffer **)((long)&__begin1_1 + lVar2),
                             *(uint64_t *)((long)&__end1_1 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x48792a;
      StreamKmerFactory128::produce_all_kmers
                (*(StreamKmerFactory128 **)(&stack0xfffffffffffffb50 + lVar2),
                 *(char **)(&stack0xfffffffffffffb48 + lVar2),
                 *(vector<unsigned___int128,_std::allocator<unsigned___int128>_> **)
                  (&stack0xfffffffffffffb40 + lVar2));
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487946;
      __end3 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::begin
                         (*(vector<unsigned___int128,_std::allocator<unsigned___int128>_> **)paVar10
                         );
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487959;
      std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::end
                (*(vector<unsigned___int128,_std::allocator<unsigned___int128>_> **)paVar10);
      while( true ) {
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487973;
        bVar3 = __gnu_cxx::operator!=
                          (*(__normal_iterator<unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                             **)(&stack0xfffffffffffffb30 + lVar2),
                           *(__normal_iterator<unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                             **)paVar10);
        if (!bVar3) break;
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487988;
        puVar12 = __gnu_cxx::
                  __normal_iterator<unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                  ::operator*(&__end3);
        local_470[2] = (long)*puVar12;
        local_470[1] = *(undefined8 *)((long)puVar12 + 8);
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x4879b7;
        peVar13 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               **)(&stack0xfffffffffffffb20 + lVar2));
        pKVar1 = peVar13->kmers;
        *(ulong *)((long)&pKVar1[skf.super_KMerFactory128.b2r._M_elems._248_8_].kdata + 8) =
             local_470[1];
        *(ulong *)&pKVar1[skf.super_KMerFactory128.b2r._M_elems._248_8_].kdata = local_470[2];
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x4879ee;
        peVar13 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               **)(&stack0xfffffffffffffb20 + lVar2));
        peVar13->kmers[skf.super_KMerFactory128.b2r._M_elems._248_8_].count = '\x01';
        skf.super_KMerFactory128.b2r._M_elems._248_8_ =
             skf.super_KMerFactory128.b2r._M_elems._248_8_ + 1;
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487a1e;
        __gnu_cxx::
        __normal_iterator<unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
        ::operator++(&__end3);
      }
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487a69;
      std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::clear
                (*(vector<unsigned___int128,_std::allocator<unsigned___int128>_> **)
                  (&stack0xfffffffffffffb20 + lVar2));
    }
    batches = batches + skf.super_KMerFactory128.b2r._M_elems._248_8_;
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487a9e;
    std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
                (&stack0xfffffffffffffb20 + lVar2));
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487aad;
    KmerList::resize(*(KmerList **)(&stack0xfffffffffffffb30 + lVar2),*(size_t *)paVar10);
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487abb;
    std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
                (&stack0xfffffffffffffb20 + lVar2));
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ac3;
    KmerList::sort(*(KmerList **)(&stack0xfffffffffffffb20 + lVar2));
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ad1;
    std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
                (&stack0xfffffffffffffb20 + lVar2));
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ad9;
    KmerList::uniq(*(KmerList **)(&stack0xfffffffffffffb50 + lVar2));
    __range1_1._6_2_ = 0;
    bVar3 = true;
    while (bVar3) {
      this_02 = &local_448[__range1_1._6_2_].super___atomic_base<unsigned_char>;
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487b10;
      bVar4 = std::__atomic_base<unsigned_char>::operator++(this_02,0);
      uVar6 = (ushort)bVar4;
      local_470[0] = (ulong)uVar6;
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487b3a;
      pvVar14 = std::
                vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ::operator[]((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                              *)local_78,(ulong)__range1_1._6_2_);
      *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487b42;
      sVar15 = std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
               size(pvVar14);
      if (local_470[0] == sVar15 - 1) {
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487b65;
        poVar9 = sdglib::OutputLog(*(LogLevels *)(&stack0xfffffffffffffb5c + lVar2),
                                   (bool)(&stack0xfffffffffffffb5b)[lVar2]);
        local_478 = poVar9;
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487b81;
        poVar9 = std::operator<<(poVar9,"level ");
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487b9f;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,__range1_1._6_2_ + 1);
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487bbb;
        poVar9 = std::operator<<(poVar9," done.");
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487bd7;
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      if ((int)(uint)__range1_1._6_2_ < (int)(elements._6_2_ - 1)) {
        if ((uint)uVar6 % 2 != 1) {
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487c25;
          pvVar14 = std::
                    vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                    ::operator[]((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                                  *)local_78,(ulong)__range1_1._6_2_);
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487c2d;
          sVar15 = std::
                   vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
                   size(pvVar14);
          if ((ulong)uVar6 != sVar15 - 1) goto LAB_00487d9e;
        }
        if ((uint)uVar6 % 2 == 1) {
          while( true ) {
            *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487c70;
            std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
            ::operator[]((vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                          *)&batch_lists.
                             super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (ulong)__range1_1._6_2_);
            *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487c87;
            _Var5 = std::__atomic_base::operator_cast_to_unsigned_char
                              (*(__atomic_base<unsigned_char> **)((long)&local_4c8 + lVar2));
            if (_Var5 == '\x01') break;
            *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487c99;
            usleep(10);
          }
          this_00 = &batch_lists.
                     super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          this_04 = this_00;
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487cb6;
          std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>::
          operator[]((vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                      *)this_00,(ulong)__range1_1._6_2_);
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487cd5;
          std::__atomic_base<unsigned_char>::operator=
                    (*(__atomic_base<unsigned_char> **)((long)&local_4c8 + lVar2),
                     (&stack0xfffffffffffffb37)[lVar2]);
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487cea;
          std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>::
          operator[]((vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                      *)this_04,(ulong)__range1_1._6_2_);
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d02;
          std::__atomic_base<unsigned_char>::operator=
                    (*(__atomic_base<unsigned_char> **)((long)&local_4c8 + lVar2),
                     (&stack0xfffffffffffffb37)[lVar2]);
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d0e;
          std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    (*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
                      (&stack0xfffffffffffffb20 + lVar2));
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d27;
          pvVar14 = std::
                    vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                    ::operator[]((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                                  *)local_78,(ulong)__range1_1._6_2_);
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d3b;
          std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
          operator[](pvVar14,(ulong)uVar6 - 1);
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d43;
          std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                    (*(__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
                      (&stack0xfffffffffffffb30 + lVar2));
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d52;
          KmerList::merge(*(KmerList **)((long)local_470 + lVar2),
                          *(KmerList **)((long)&local_478 + lVar2));
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d66;
          pvVar14 = std::
                    vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                    ::operator[]((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                                  *)local_78,(ulong)__range1_1._6_2_);
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d7b;
          std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
          operator[](pvVar14,(long)(int)(uVar6 - 1));
          *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487d83;
          std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::reset
                    (*(__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> **)
                      (&stack0xfffffffffffffb40 + lVar2));
        }
        __range1_1._6_2_ = __range1_1._6_2_ + 1;
        bVar3 = true;
      }
      else {
LAB_00487d9e:
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487db0;
        pvVar14 = std::
                  vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                  ::operator[]((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                                *)local_78,(ulong)__range1_1._6_2_);
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487dc1;
        std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::
        operator[](pvVar14,(ulong)uVar6);
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487dd0;
        std::shared_ptr<KmerList>::operator=
                  (*(shared_ptr<KmerList> **)(&stack0xfffffffffffffb30 + lVar2),
                   *(shared_ptr<KmerList> **)paVar10);
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487ddc;
        std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::reset
                  (*(__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> **)
                    (&stack0xfffffffffffffb40 + lVar2));
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487dee;
        std::vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>::
        operator[]((vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                    *)&batch_lists.
                       super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)__range1_1._6_2_);
        *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e05;
        std::__atomic_base<unsigned_char>::operator=
                  (*(__atomic_base<unsigned_char> **)((long)&local_4c8 + lVar2),
                   (&stack0xfffffffffffffb37)[lVar2]);
        bVar3 = false;
      }
    }
    *(undefined8 *)(&stack0xfffffffffffffb20 + lVar2) = 0x487e1d;
    std::shared_ptr<KmerList>::~shared_ptr
              (*(shared_ptr<KmerList> **)(&stack0xfffffffffffffb20 + lVar2));
    from._4_4_ = from._4_4_ + 1;
  } while( true );
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::kmerCountOMP(uint8_t K, PairedReadsDatastore const &reads, uint64_t gfrom, uint64_t gto, uint64_t batch_size) {
    uint64_t totalKmers(0);
    //Compute how many "batches" will be used. and malloc a structure for them and a bool array to mark them "ready to process".
    //optionally, there could be a total count of "ready kmers" to set a limit for memory usage, if total count is too high, slaves would wait
    if (batch_size == 0) batch_size = (gto - gfrom) / (4 * omp_get_max_threads()) + 1;
    const uint64_t batches = ((gto - gfrom) + batch_size - 1) / batch_size;
    sdglib::OutputLog() << "OMP-merge kmer counting in " << batches << " batches of " << batch_size << " reads" << std::endl;

    std::vector<std::atomic_uint_fast8_t *> batch_status; //level->batch->status

    std::vector<std::vector<std::shared_ptr<KmerList>>> batch_lists; //level->batch-> pointer to batch
    uint16_t levels = 0;
    for (auto elements = batches; elements > 1; elements = (elements + 1) / 2) {
        batch_status.push_back((std::atomic_uint_fast8_t *) calloc(sizeof(std::atomic_uint_fast8_t), elements));
        batch_lists.emplace_back();
        batch_lists.back().resize(elements);
//        sdglib::OutputLog() << "level " << levels << " created with " << elements << " elements " << std::endl;
        ++levels;
    }
    sdglib::OutputLog() << "Created " << levels << " levels" << std::endl;
    std::atomic_uint_fast8_t level_count[levels]; //level->count
    for (auto &l:level_count)l = 0;

#pragma omp parallel shared(reads) reduction(+:totalKmers)
    {
        ReadSequenceBuffer bprsg(reads,100000,1000);
        std::vector<__uint128_t> read_kmers;
#pragma omp for schedule(dynamic)
        for (auto batch = 0; batch < batches; ++batch) {
            //==== Part 1: actually counting ====
            uint64_t from = gfrom + batch * batch_size;
            uint64_t read_count = (batch < batches - 1) ? batch_size : (gto - gfrom) - batch_size * (batches - 1);
            uint64_t to = from + read_count;

            std::shared_ptr<KmerList> local_kmer_list = std::make_shared<KmerList>();
            uint64_t total_good_length = reads.readsize*(to-from+1);
            local_kmer_list->resize(total_good_length);
            //Populate the kmer list
            uint64_t last_kmer=0;

            // Replace with generating all the kmers from the reads!
            StreamKmerFactory128 skf(K);

            for (uint64_t rid=from+1; rid<= to; ++rid) {
                skf.produce_all_kmers(bprsg.get_read_sequence(rid), read_kmers);
                for (const auto &rk: read_kmers){
                    local_kmer_list->kmers[last_kmer].kdata=rk;
                    local_kmer_list->kmers[last_kmer].count=1;
                    ++last_kmer;
                }
                read_kmers.clear();
            }

            totalKmers += last_kmer;
            //std::cout<<last_kmer<<" kmers inserted in a batch"<<std::endl;
            local_kmer_list->resize(last_kmer);
            local_kmer_list->sort();
            local_kmer_list->uniq();
            //std::cout<<local_kmer_list->size<<" unique kmers in a batch"<<std::endl;
            //std::sort(local_kmer_list->begin(), local_kmer_list->end());
            //collapse_entries(*local_kmer_list);

            //==== Part 2: merging till no results of same level available ====
            //merge_level=0
            uint16_t merge_level = 0;
            bool just_merged = true;
            //while (just merged)
            while (just_merged) {
                //   insert the list into this merge level's queue
                uint16_t slot = level_count[merge_level]++;
                if (slot == batch_lists[merge_level].size() - 1) {
#pragma omp critical
                    sdglib::OutputLog() << "level " << (merge_level+1) << " done." << std::endl;
                }
                //   if insertion number is odd or last batch:
                if (merge_level < levels - 1 and (slot % 2 == 1 or slot == batch_lists[merge_level].size() - 1)) {
                    // mix with the previous even number (using own list as base, this way we preserve locality)
                    if (slot % 2 == 1) {
                        while (batch_status[merge_level][slot - 1] != 1)
                            usleep(10); //wait for the previous batch to be finished.
                        batch_status[merge_level][slot - 1] = 2;
                        batch_status[merge_level][slot] = 2;
                        //inplace_count_merge(local_kmer_list, batch_lists[merge_level][slot - 1]);
                        local_kmer_list->merge(*batch_lists[merge_level][slot - 1]);
                        batch_lists[merge_level][slot - 1].reset();
                    }
                    //      increase level
                    ++merge_level;
                    just_merged = true;
                } else {
                    // no batch available for merging, next thread at this level will pick up
                    batch_lists[merge_level][slot] = local_kmer_list;
                    local_kmer_list.reset();
                    batch_status[merge_level][slot] = 1;
                    just_merged = false;
                }
                //IDEA: fixed partitioning can be used to keep 2*thread-number lists for longer.
            }
        }

    }


//    sdglib::OutputLog() << "Top level merge starting" << std::endl;
    //inplace_count_merge(batch_lists.back()[0], batch_lists.back()[1]);
    batch_lists.back()[0]->merge(*batch_lists.back()[1]);
//    sdglib::OutputLog() << "Top level merge done" << std::endl;
    std::shared_ptr<KmerList> kmer_list = batch_lists.back()[0];
    batch_lists.back()[0].reset();
    batch_lists.back()[1].reset();
    for (auto &bs:batch_status) free(bs);
//    sdglib::OutputLog() << "cleanup done" << std::endl;
    sdglib::OutputLog() << "Total kmers processed " << totalKmers << std::endl;
    return kmer_list;
}